

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_image_flip_vertical(rf_image *__return_storage_ptr__,rf_image image,rf_allocator allocator)

{
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_allocator_args rVar3;
  undefined1 auVar4 [24];
  int iVar5;
  void *dst;
  rf_allocator allocator_local;
  uint uStack_7c;
  uint uStack_4c;
  
  allocator_local.user_data = allocator.user_data;
  if (image.valid == false) {
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->format = 0;
    __return_storage_ptr__->valid = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  }
  else {
    allocator_local.allocator_proc = allocator.allocator_proc;
    iVar5 = rf_pixel_buffer_size(image.width,image.height,image.format);
    rVar1.proc_name = "rf_image_flip_vertical";
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.line_in_file = 0x3fdf;
    auVar4._8_8_ = (ulong)uStack_4c << 0x20;
    auVar4._0_8_ = (long)iVar5;
    auVar4._16_8_ = 0;
    dst = (*allocator.allocator_proc)
                    (&allocator_local,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar4 << 0x40));
    rf_image_flip_vertical_to_buffer(__return_storage_ptr__,image,dst,(long)iVar5);
    if (__return_storage_ptr__->valid == false) {
      rVar2.proc_name = "rf_image_flip_vertical";
      rVar2.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar2.line_in_file = 0x3fe2;
      rVar3.size_to_allocate_or_reallocate = 0;
      rVar3.pointer_to_free_or_realloc = dst;
      rVar3._16_8_ = (ulong)uStack_7c << 0x20;
      (*allocator_local.allocator_proc)(&allocator_local,rVar2,RF_AM_FREE,rVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_flip_vertical(rf_image image, rf_allocator allocator)
{
    if (!image.valid) return (rf_image) {0};

    int size = rf_image_size(image);
    void* dst = RF_ALLOC(allocator, size);

    rf_image result = rf_image_flip_vertical_to_buffer(image, dst, size);
    if (!result.valid) RF_FREE(allocator, dst);

    return result;
}